

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::GridAxisRegular::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridAxisRegular *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Grid Axis Regular:",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tDomain Initial Xi:   ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64DomainInitialXi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tDomain Final Xi:     ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64DomainFinalXi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tDomain Points Xi:    ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tInterleaf Factor:    ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAxis Type:           ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tNumber Of Points:    ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tInitial Index:       ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString GridAxisRegular::GetAsString() const
{
    KStringStream ss;

    ss << "Grid Axis Regular:"
       << "\n\tDomain Initial Xi:   " << m_f64DomainInitialXi
       << "\n\tDomain Final Xi:     " << m_f64DomainFinalXi
       << "\n\tDomain Points Xi:    " << m_ui16DomainPointsXi
       << "\n\tInterleaf Factor:    " << ( KUINT16 )m_ui8InterleafFactor
       << "\n\tAxis Type:           " << ( KUINT16 )m_ui8AxisType
       << "\n\tNumber Of Points:    " << m_ui16NumPoints
       << "\n\tInitial Index:       " << m_ui16InitialIndex
       << "\n";

    return ss.str();
}